

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vctsxs_ppc64(CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *b,uint32_t uim)

{
  int iVar1;
  int32_t iVar2;
  float64 fVar3;
  int64_t x;
  int64_t j;
  float64 t;
  float_status s;
  int sat;
  int i;
  uint32_t uim_local;
  ppc_avr_t *b_local;
  ppc_avr_t *r_local;
  CPUPPCState_conflict2 *env_local;
  
  s.float_detect_tininess = '\0';
  s.float_rounding_mode = '\0';
  s.float_exception_flags = '\0';
  s.floatx80_rounding_precision = '\0';
  unique0x00012000 = env->vec_status;
  set_float_rounding_mode(3,(float_status *)((long)&t + 4));
  s.flush_to_zero = '\0';
  s.flush_inputs_to_zero = '\0';
  s.default_nan_mode = '\0';
  s.snan_bit_is_one = '\0';
  for (; (uint)s._4_4_ < 4; s._4_4_ = s._4_4_ + 1) {
    iVar1 = float32_is_any_nan(b->f32[(int)s._4_4_]);
    if (iVar1 == 0) {
      fVar3 = float32_to_float64_ppc64(b->f32[(int)s._4_4_],(float_status *)((long)&t + 4));
      fVar3 = float64_scalbn_ppc64(fVar3,uim,(float_status *)((long)&t + 4));
      x = float64_to_int64_ppc64(fVar3,(float_status *)((long)&t + 4));
      iVar2 = cvtsdsw(x,(int *)&s);
      r->s32[(int)s._4_4_] = iVar2;
    }
    else {
      r->u32[(int)s._4_4_] = 0;
    }
  }
  if (s._0_4_ != 0) {
    set_vscr_sat(env);
  }
  return;
}

Assistant:

target_ulong helper_vclzlsbb(ppc_avr_t *r)
{
    target_ulong count = 0;
    int i;
    for (i = 0; i < ARRAY_SIZE(r->u8); i++) {
        if (r->VsrB(i) & 0x01) {
            break;
        }
        count++;
    }
    return count;
}